

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

QString * __thiscall
QWidgetLineControl::clearString
          (QString *__return_storage_ptr__,QWidgetLineControl *this,int pos,int len)

{
  int iVar1;
  int iVar2;
  type pMVar3;
  size_t __i;
  
  iVar1 = *(int *)(this + 0x60);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  if (pos < iVar1) {
    iVar2 = len + pos;
    if (iVar1 < len + pos) {
      iVar2 = iVar1;
    }
    for (__i = (size_t)pos; (long)__i < (long)iVar2; __i = __i + 1) {
      pMVar3 = std::
               unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                             *)(this + 0xe8),__i);
      if (pMVar3->separator == true) {
        std::
        unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
        ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)(this + 0xe8),__i);
      }
      QString::append((QChar)(char16_t)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWidgetLineControl::clearString(int pos, int len) const
{
    if (pos >= m_maxLength)
        return QString();

    QString s;
    int end = qMin(m_maxLength, pos + len);
    for (int i = pos; i < end; ++i)
        if (m_maskData[i].separator)
            s += m_maskData[i].maskChar;
        else
            s += m_blank;

    return s;
}